

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O0

RealType __thiscall OpenMD::NVT::calcConservedQuantity(NVT *this)

{
  int iVar1;
  long in_RDI;
  double dVar2;
  RealType RVar3;
  pair<double,_double> pVar4;
  RealType thermostat_potential;
  RealType thermostat_kinetic;
  RealType Energy;
  RealType fkBT;
  RealType conservedQuantity;
  pair<double,_double> thermostat;
  SimInfo *in_stack_ffffffffffffffc0;
  Thermo *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  undefined8 local_10;
  
  pVar4 = Snapshot::getThermostat(*(Snapshot **)(in_RDI + 0xe0));
  iVar1 = SimInfo::getNdf(in_stack_ffffffffffffffc0);
  dVar2 = (double)iVar1 * 8.31451e-07 * *(double *)(in_RDI + 0x100);
  RVar3 = Thermo::getTotalEnergy(in_stack_ffffffffffffffd0);
  local_18 = pVar4.first;
  local_10 = pVar4.second;
  return RVar3 + (dVar2 * *(double *)(in_RDI + 0x108) * *(double *)(in_RDI + 0x108) * local_18 *
                 local_18) / 0.0008368 + (dVar2 * local_10) / 0.0004184;
}

Assistant:

RealType NVT::calcConservedQuantity() {
    pair<RealType, RealType> thermostat = snap->getThermostat();
    RealType conservedQuantity;
    RealType fkBT;
    RealType Energy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;

    fkBT = info_->getNdf() * Constants::kB * targetTemp_;

    Energy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tauThermostat_ * tauThermostat_ *
                         thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    conservedQuantity = Energy + thermostat_kinetic + thermostat_potential;

    return conservedQuantity;
  }